

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qurl.cpp
# Opt level: O2

QString * __thiscall
QUrl::toString(QString *__return_storage_ptr__,QUrl *this,FormattingOptions options)

{
  qsizetype qVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  bool bVar4;
  QUrlPrivate *pQVar5;
  FormattingOptions options_00;
  long in_FS_OFFSET;
  QLatin1StringView str;
  QLatin1StringView str_00;
  QMessageLogger local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = 0;
  bVar4 = isValid(this);
  if (!bVar4) goto LAB_00240317;
  if ((~options.i & 0x7f00000U) == 0) {
    local_48.context.version = 2;
    local_48.context.function._4_4_ = 0;
    local_48.context.line = 0;
    local_48.context.file._0_2_ = L'\0';
    local_48.context.file._2_2_ = 0;
    local_48.context.file._4_4_ = 0;
    local_48.context.function._0_4_ = 0;
    local_48.context.category = "default";
    QMessageLogger::warning
              (&local_48,
               "QUrl: QUrl::FullyDecoded is not permitted when reconstructing the full URL");
    options.i = options.i & 0xf80fffff;
  }
  pQVar5 = this->d;
  if (((((options.i & 0x220U) == 0x200) &&
       (((options.i & 0x40U) == 0 & (pQVar5->sectionIsPresent & 0x40) >> 6) == 0)) &&
      ((char)options.i < '\0' || -1 < (char)pQVar5->sectionIsPresent)) && ((pQVar5->flags & 1) != 0)
     ) {
    QUrlPrivate::toLocalFile((QString *)&local_48,pQVar5,(FormattingOptions)(options.i | 0x7f00000))
    ;
    pDVar2 = (__return_storage_ptr__->d).d;
    pcVar3 = (__return_storage_ptr__->d).ptr;
    (__return_storage_ptr__->d).d = (Data *)CONCAT44(local_48.context.line,local_48.context.version)
    ;
    (__return_storage_ptr__->d).ptr =
         (char16_t *)
         CONCAT44(local_48.context.file._4_4_,
                  CONCAT22(local_48.context.file._2_2_,(char16_t)local_48.context.file));
    local_48.context.version = (int)pDVar2;
    local_48.context.line = (int)((ulong)pDVar2 >> 0x20);
    local_48.context.file._0_2_ = (char16_t)pcVar3;
    local_48.context.file._2_2_ = (undefined2)((ulong)pcVar3 >> 0x10);
    local_48.context.file._4_4_ = (undefined4)((ulong)pcVar3 >> 0x20);
    qVar1 = (__return_storage_ptr__->d).size;
    (__return_storage_ptr__->d).size =
         CONCAT44(local_48.context.function._4_4_,local_48.context.function._0_4_);
    local_48.context.function._0_4_ = (undefined4)qVar1;
    local_48.context.function._4_4_ = (undefined4)((ulong)qVar1 >> 0x20);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_48);
    goto LAB_00240317;
  }
  local_48.context._0_8_ = (QString *)CONCAT44(local_48.context.line,local_48.context.version);
  if (((options.i & 1U) == 0) &&
     (local_48.context._0_8_ = (QString *)CONCAT44(local_48.context.line,local_48.context.version),
     (pQVar5->sectionIsPresent & 1) != 0)) {
    local_48.context._0_8_ = &pQVar5->scheme;
    local_48.context.file._0_2_ = L':';
    ::operator+=(__return_storage_ptr__,(QStringBuilder<QString_&,_char16_t> *)&local_48);
    pQVar5 = this->d;
  }
  bVar4 = QString::startsWith(&pQVar5->path,(QChar)0x2f,CaseSensitive);
  options_00.i = ((uint)options.i >> 1 & 0x1000000 | options.i & 0xfeffffffU) ^ 0x1000000;
  pQVar5 = this->d;
  if ((~options.i & 0x1eU) == 0) {
    if (pQVar5 != (QUrlPrivate *)0x0) {
LAB_00240244:
      if (bVar4 && (pQVar5->flags & 1) != 0) {
        str_00.m_data = "//";
        str_00.m_size = 2;
        QString::append(__return_storage_ptr__,str_00);
      }
    }
  }
  else {
    if ((pQVar5->sectionIsPresent & 0x1e) == 0) goto LAB_00240244;
    str.m_data = "//";
    str.m_size = 2;
    QString::append(__return_storage_ptr__,str);
    QUrlPrivate::appendAuthority(this->d,__return_storage_ptr__,options_00,FullUrl);
  }
  if ((options.i & 0x20U) == 0) {
    QUrlPrivate::appendPath(this->d,__return_storage_ptr__,options_00,FullUrl);
  }
  if (((options.i & 0x40U) == 0) && ((this->d->sectionIsPresent & 0x40) != 0)) {
    QString::append(__return_storage_ptr__,(QChar)0x3f);
    QUrlPrivate::appendQuery(this->d,__return_storage_ptr__,options_00,FullUrl);
  }
  if ((-1 < (char)options.i) && ((char)this->d->sectionIsPresent < '\0')) {
    QString::append(__return_storage_ptr__,(QChar)0x23);
    QUrlPrivate::appendFragment(this->d,__return_storage_ptr__,options_00,FullUrl);
  }
LAB_00240317:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QString QUrl::toString(FormattingOptions options) const
{
    QString url;
    if (!isValid()) {
        // also catches isEmpty()
        return url;
    }
    if ((options & QUrl::FullyDecoded) == QUrl::FullyDecoded) {
        qWarning("QUrl: QUrl::FullyDecoded is not permitted when reconstructing the full URL");
        options &= ~QUrl::FullyDecoded;
        //options |= QUrl::PrettyDecoded; // no-op, value is 0
    }

    // return just the path if:
    //  - QUrl::PreferLocalFile is passed
    //  - QUrl::RemovePath isn't passed (rather stupid if the user did...)
    //  - there's no query or fragment to return
    //    that is, either they aren't present, or we're removing them
    //  - it's a local file
    if (options.testFlag(QUrl::PreferLocalFile) && !options.testFlag(QUrl::RemovePath)
            && (!d->hasQuery() || options.testFlag(QUrl::RemoveQuery))
            && (!d->hasFragment() || options.testFlag(QUrl::RemoveFragment))
            && isLocalFile()) {
        url = d->toLocalFile(options | QUrl::FullyDecoded);
        return url;
    }

    // for the full URL, we consider that the reserved characters are prettier if encoded
    if (options & DecodeReserved)
        options &= ~EncodeReserved;
    else
        options |= EncodeReserved;

    if (!(options & QUrl::RemoveScheme) && d->hasScheme())
        url += d->scheme + u':';

    bool pathIsAbsolute = d->path.startsWith(u'/');
    if (!((options & QUrl::RemoveAuthority) == QUrl::RemoveAuthority) && d->hasAuthority()) {
        url += "//"_L1;
        d->appendAuthority(url, options, QUrlPrivate::FullUrl);
    } else if (isLocalFile() && pathIsAbsolute) {
        // Comply with the XDG file URI spec, which requires triple slashes.
        url += "//"_L1;
    }

    if (!(options & QUrl::RemovePath))
        d->appendPath(url, options, QUrlPrivate::FullUrl);

    if (!(options & QUrl::RemoveQuery) && d->hasQuery()) {
        url += u'?';
        d->appendQuery(url, options, QUrlPrivate::FullUrl);
    }
    if (!(options & QUrl::RemoveFragment) && d->hasFragment()) {
        url += u'#';
        d->appendFragment(url, options, QUrlPrivate::FullUrl);
    }

    return url;
}